

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_intervals.h
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
Gudhi::Persistence_representations::Persistence_intervals::characteristic_function_of_diagram
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          Persistence_intervals *this,double x_min,double x_max,size_t number_of_bins)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer ppVar4;
  pointer ppVar5;
  ulong uVar6;
  pointer pdVar7;
  size_t i;
  long lVar8;
  size_t pos;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  allocator_type local_31;
  double local_30;
  double local_28;
  
  local_30 = x_min;
  local_28 = x_max;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,number_of_bins,&local_31);
  pdVar3 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (pdVar7 = pdVar2; pdVar7 != pdVar3; pdVar7 = pdVar7 + 1) {
    *pdVar7 = 0.0;
  }
  ppVar4 = (this->intervals).
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (this->intervals).
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar6 = (long)pdVar3 - (long)pdVar2 >> 3;
  auVar14._8_4_ = (int)(number_of_bins >> 0x20);
  auVar14._0_8_ = number_of_bins;
  auVar14._12_4_ = 0x45300000;
  dVar12 = (auVar14._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)number_of_bins) - 4503599627370496.0);
  dVar13 = local_28 - local_30;
  for (lVar8 = 0; lVar8 != (long)ppVar5 - (long)ppVar4 >> 4; lVar8 = lVar8 + 1) {
    dVar1 = ppVar4[lVar8].first;
    uVar9 = uVar6;
    if (dVar1 < local_28) {
      uVar9 = 0;
    }
    dVar15 = ((dVar1 - local_30) * dVar12) / dVar13;
    uVar10 = (ulong)dVar15;
    uVar10 = (long)(dVar15 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10;
    if (local_28 <= dVar1) {
      uVar10 = uVar9;
    }
    if (dVar1 <= local_30) {
      uVar10 = uVar9;
    }
    dVar1 = ppVar4[lVar8].second;
    uVar9 = uVar6;
    if (dVar1 < local_28) {
      uVar9 = 0;
    }
    dVar15 = ((dVar1 - local_30) * dVar12) / dVar13;
    uVar11 = (ulong)dVar15;
    uVar11 = (long)(dVar15 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11;
    if (local_28 <= dVar1) {
      uVar11 = uVar9;
    }
    if (dVar1 <= local_30) {
      uVar11 = uVar9;
    }
    if (uVar11 <= uVar10) {
      uVar10 = uVar11;
    }
    for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
      pdVar2[uVar10] =
           (ppVar4[lVar8].second - ppVar4[lVar8].first) * (dVar13 / dVar12) + pdVar2[uVar10];
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> Persistence_intervals::characteristic_function_of_diagram(double x_min, double x_max,
                                                                              size_t number_of_bins) const {
  bool dbg = false;

  std::vector<double> result(number_of_bins);
  std::fill(result.begin(), result.end(), 0);

  for (size_t i = 0; i != this->intervals.size(); ++i) {
    if (dbg) {
      std::clog << "Interval : " << this->intervals[i].first << " , " << this->intervals[i].second << std::endl;
    }

    size_t beginIt = 0;
    if (this->intervals[i].first < x_min) beginIt = 0;
    if (this->intervals[i].first >= x_max) beginIt = result.size();
    if ((this->intervals[i].first > x_min) && (this->intervals[i].first < x_max)) {
      beginIt = number_of_bins * (this->intervals[i].first - x_min) / (x_max - x_min);
    }

    size_t endIt = 0;
    if (this->intervals[i].second < x_min) endIt = 0;
    if (this->intervals[i].second >= x_max) endIt = result.size();
    if ((this->intervals[i].second > x_min) && (this->intervals[i].second < x_max)) {
      endIt = number_of_bins * (this->intervals[i].second - x_min) / (x_max - x_min);
    }

    if (beginIt > endIt) {
      beginIt = endIt;
    }

    if (dbg) {
      std::clog << "beginIt : " << beginIt << std::endl;
      std::clog << "endIt : " << endIt << std::endl;
    }

    for (size_t pos = beginIt; pos != endIt; ++pos) {
      result[pos] += ((x_max - x_min) / static_cast<double>(number_of_bins)) *
                     (this->intervals[i].second - this->intervals[i].first);
    }
    if (dbg) {
      std::clog << "Result at this stage \n";
      for (size_t aa = 0; aa != result.size(); ++aa) {
        std::clog << result[aa] << " ";
      }
      std::clog << std::endl;
    }
  }
  return result;
}